

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

xmlChar * htmlParseHTMLAttribute(htmlParserCtxtPtr ctxt,xmlChar stop)

{
  uint uVar1;
  byte *pbVar2;
  htmlEntityDesc *phVar3;
  byte *pbVar4;
  int iVar5;
  byte bVar6;
  uint uVar7;
  byte *pbVar8;
  int iVar9;
  byte *pbVar10;
  long lVar11;
  long lVar12;
  byte *local_58;
  xmlChar *name;
  int l;
  
  name = (xmlChar *)0x0;
  pbVar2 = (byte *)(*xmlMallocAtomic)(100);
  if (pbVar2 == (byte *)0x0) {
    htmlErrMemory(ctxt,"buffer allocation failed\n");
    return (xmlChar *)0x0;
  }
  iVar9 = 100;
  pbVar10 = pbVar2;
LAB_0014e370:
  do {
    lVar11 = (long)(iVar9 + -100);
LAB_0014e382:
    pbVar8 = ctxt->input->cur;
    bVar6 = *pbVar8;
    uVar1 = (uint)bVar6;
    if (((bVar6 == 0) || (bVar6 == stop)) || (bVar6 == 0x3e && stop == '\0')) {
LAB_0014e700:
      *pbVar2 = 0;
      return pbVar10;
    }
    if (stop != '\0') {
      if (uVar1 != 0x26) goto LAB_0014e4b5;
LAB_0014e3da:
      if (pbVar8[1] == 0x23) {
        uVar1 = htmlParseCharRef(ctxt);
        if (uVar1 < 0x80) {
          iVar5 = -6;
          uVar7 = uVar1;
LAB_0014e3f1:
          bVar6 = (byte)uVar7;
        }
        else {
          if (0x7ff < uVar1) {
            if (uVar1 < 0x10000) {
              uVar7 = (uint)(byte)((byte)(uVar1 >> 0xc) | 0xe0);
              iVar5 = 6;
            }
            else {
              uVar7 = (uint)((byte)(uVar1 >> 0x12) & 7 | 0xf0);
              iVar5 = 0xc;
            }
            goto LAB_0014e3f1;
          }
          bVar6 = (byte)(uVar1 >> 6) | 0xc0;
          iVar5 = 0;
        }
        *pbVar2 = bVar6;
        pbVar8 = pbVar2 + (1 - (long)pbVar10);
        lVar12 = (long)pbVar8 << 0x20;
        for (; pbVar2 = pbVar2 + 1, -1 < iVar5; iVar5 = iVar5 + -6) {
          *pbVar2 = (byte)(uVar1 >> ((byte)iVar5 & 0x1f)) & 0x3f | 0x80;
          lVar12 = lVar12 + 0x100000000;
          pbVar8 = pbVar8 + 1;
        }
        if (lVar11 < (long)pbVar8) break;
        goto LAB_0014e382;
      }
      phVar3 = htmlParseEntityRef(ctxt,&name);
      if (name == (xmlChar *)0x0) {
        *pbVar2 = 0x26;
        pbVar2 = pbVar2 + 1;
        if (lVar11 < (long)pbVar2 - (long)pbVar10) {
          pbVar8 = (byte *)(*xmlRealloc)(pbVar10,(long)(iVar9 * 2));
          if (pbVar8 == (byte *)0x0) goto LAB_0014e748;
          pbVar2 = pbVar8 + (int)((long)pbVar2 - (long)pbVar10);
          goto LAB_0014e617;
        }
        goto LAB_0014e382;
      }
      if (phVar3 == (htmlEntityDesc *)0x0) {
        *pbVar2 = 0x26;
        pbVar8 = name;
        goto LAB_0014e64c;
      }
      pbVar8 = pbVar10;
      if (lVar11 < (long)pbVar2 - (long)pbVar10) {
        iVar9 = iVar9 * 2;
        pbVar8 = (byte *)(*xmlRealloc)(pbVar10,(long)iVar9);
        if (pbVar8 == (byte *)0x0) goto LAB_0014e72b;
        pbVar2 = pbVar8 + (int)((long)pbVar2 - (long)pbVar10);
      }
      uVar1 = phVar3->value;
      if (uVar1 < 0x80) {
        iVar5 = -6;
        uVar7 = uVar1;
LAB_0014e5b3:
        bVar6 = (byte)uVar7;
      }
      else {
        if (0x7ff < uVar1) {
          if (uVar1 < 0x10000) {
            uVar7 = (uint)(byte)((byte)(uVar1 >> 0xc) | 0xe0);
            iVar5 = 6;
          }
          else {
            uVar7 = (uint)((byte)(uVar1 >> 0x12) & 7 | 0xf0);
            iVar5 = 0xc;
          }
          goto LAB_0014e5b3;
        }
        bVar6 = (byte)(uVar1 >> 6) | 0xc0;
        iVar5 = 0;
      }
      *pbVar2 = bVar6;
      for (; pbVar2 = pbVar2 + 1, pbVar10 = pbVar8, -1 < iVar5; iVar5 = iVar5 + -6) {
        *pbVar2 = (byte)(uVar1 >> ((byte)iVar5 & 0x1f)) & 0x3f | 0x80;
      }
      goto LAB_0014e370;
    }
    if (uVar1 < 0x27) {
      if ((ulong)uVar1 == 0x26) goto LAB_0014e3da;
      if ((0x100002600U >> ((ulong)uVar1 & 0x3f) & 1) != 0) goto LAB_0014e700;
    }
LAB_0014e4b5:
    local_58 = pbVar10;
    if (lVar11 < (long)pbVar2 - (long)pbVar10) {
      iVar9 = iVar9 * 2;
      local_58 = (byte *)(*xmlRealloc)(pbVar10,(long)iVar9);
      if (local_58 == (byte *)0x0) {
        htmlErrMemory(ctxt,"growing buffer\n");
        goto LAB_0014e77e;
      }
      pbVar2 = local_58 + (int)((long)pbVar2 - (long)pbVar10);
    }
    uVar1 = htmlCurrentChar(ctxt,&l);
    if (uVar1 < 0x80) {
      iVar5 = -6;
      uVar7 = uVar1;
LAB_0014e50b:
      bVar6 = (byte)uVar7;
    }
    else {
      if (0x7ff < uVar1) {
        if (uVar1 < 0x10000) {
          uVar7 = (uint)(byte)((byte)(uVar1 >> 0xc) | 0xe0);
          iVar5 = 6;
        }
        else {
          uVar7 = (uint)((byte)(uVar1 >> 0x12) & 7 | 0xf0);
          iVar5 = 0xc;
        }
        goto LAB_0014e50b;
      }
      bVar6 = (byte)(uVar1 >> 6) | 0xc0;
      iVar5 = 0;
    }
    *pbVar2 = bVar6;
    for (; pbVar2 = pbVar2 + 1, -1 < iVar5; iVar5 = iVar5 + -6) {
      *pbVar2 = (byte)(uVar1 >> ((byte)iVar5 & 0x1f)) & 0x3f | 0x80;
    }
    xmlNextChar(ctxt);
    pbVar10 = local_58;
  } while( true );
  pbVar8 = (byte *)(*xmlRealloc)(pbVar10,(long)(iVar9 * 2));
  if (pbVar8 == (byte *)0x0) {
LAB_0014e748:
    htmlErrMemory(ctxt,"growing buffer\n");
LAB_0014e77e:
    (*xmlFree)(pbVar10);
    return (xmlChar *)0x0;
  }
  pbVar2 = pbVar8 + (lVar12 >> 0x20);
LAB_0014e617:
  iVar9 = iVar9 * 2;
  pbVar10 = pbVar8;
  goto LAB_0014e370;
LAB_0014e64c:
  pbVar2 = pbVar2 + 1;
  bVar6 = *pbVar8;
  if (bVar6 == 0) goto LAB_0014e370;
  pbVar4 = pbVar10;
  if ((long)(iVar9 + -100) < (long)pbVar2 - (long)pbVar10) {
    iVar9 = iVar9 * 2;
    pbVar4 = (byte *)(*xmlRealloc)(pbVar10,(long)iVar9);
    if (pbVar4 == (byte *)0x0) goto LAB_0014e72b;
    pbVar2 = pbVar4 + (int)((long)pbVar2 - (long)pbVar10);
    bVar6 = *pbVar8;
  }
  pbVar8 = pbVar8 + 1;
  *pbVar2 = bVar6;
  pbVar10 = pbVar4;
  goto LAB_0014e64c;
LAB_0014e72b:
  htmlErrMemory(ctxt,"growing buffer\n");
  goto LAB_0014e77e;
}

Assistant:

static xmlChar *
htmlParseHTMLAttribute(htmlParserCtxtPtr ctxt, const xmlChar stop) {
    xmlChar *buffer = NULL;
    int buffer_size = 0;
    xmlChar *out = NULL;
    const xmlChar *name = NULL;
    const xmlChar *cur = NULL;
    const htmlEntityDesc * ent;

    /*
     * allocate a translation buffer.
     */
    buffer_size = HTML_PARSER_BUFFER_SIZE;
    buffer = (xmlChar *) xmlMallocAtomic(buffer_size);
    if (buffer == NULL) {
	htmlErrMemory(ctxt, "buffer allocation failed\n");
	return(NULL);
    }
    out = buffer;

    /*
     * Ok loop until we reach one of the ending chars
     */
    while ((CUR != 0) && (CUR != stop)) {
	if ((stop == 0) && (CUR == '>')) break;
	if ((stop == 0) && (IS_BLANK_CH(CUR))) break;
        if (CUR == '&') {
	    if (NXT(1) == '#') {
		unsigned int c;
		int bits;

		c = htmlParseCharRef(ctxt);
		if      (c <    0x80)
		        { *out++  = c;                bits= -6; }
		else if (c <   0x800)
		        { *out++  =((c >>  6) & 0x1F) | 0xC0;  bits=  0; }
		else if (c < 0x10000)
		        { *out++  =((c >> 12) & 0x0F) | 0xE0;  bits=  6; }
		else
		        { *out++  =((c >> 18) & 0x07) | 0xF0;  bits= 12; }

		for ( ; bits >= 0; bits-= 6) {
		    *out++  = ((c >> bits) & 0x3F) | 0x80;
		}

		if (out - buffer > buffer_size - 100) {
			int indx = out - buffer;

			growBuffer(buffer);
			out = &buffer[indx];
		}
	    } else {
		ent = htmlParseEntityRef(ctxt, &name);
		if (name == NULL) {
		    *out++ = '&';
		    if (out - buffer > buffer_size - 100) {
			int indx = out - buffer;

			growBuffer(buffer);
			out = &buffer[indx];
		    }
		} else if (ent == NULL) {
		    *out++ = '&';
		    cur = name;
		    while (*cur != 0) {
			if (out - buffer > buffer_size - 100) {
			    int indx = out - buffer;

			    growBuffer(buffer);
			    out = &buffer[indx];
			}
			*out++ = *cur++;
		    }
		} else {
		    unsigned int c;
		    int bits;

		    if (out - buffer > buffer_size - 100) {
			int indx = out - buffer;

			growBuffer(buffer);
			out = &buffer[indx];
		    }
		    c = ent->value;
		    if      (c <    0x80)
			{ *out++  = c;                bits= -6; }
		    else if (c <   0x800)
			{ *out++  =((c >>  6) & 0x1F) | 0xC0;  bits=  0; }
		    else if (c < 0x10000)
			{ *out++  =((c >> 12) & 0x0F) | 0xE0;  bits=  6; }
		    else
			{ *out++  =((c >> 18) & 0x07) | 0xF0;  bits= 12; }

		    for ( ; bits >= 0; bits-= 6) {
			*out++  = ((c >> bits) & 0x3F) | 0x80;
		    }
		}
	    }
	} else {
	    unsigned int c;
	    int bits, l;

	    if (out - buffer > buffer_size - 100) {
		int indx = out - buffer;

		growBuffer(buffer);
		out = &buffer[indx];
	    }
	    c = CUR_CHAR(l);
	    if      (c <    0x80)
		    { *out++  = c;                bits= -6; }
	    else if (c <   0x800)
		    { *out++  =((c >>  6) & 0x1F) | 0xC0;  bits=  0; }
	    else if (c < 0x10000)
		    { *out++  =((c >> 12) & 0x0F) | 0xE0;  bits=  6; }
	    else
		    { *out++  =((c >> 18) & 0x07) | 0xF0;  bits= 12; }

	    for ( ; bits >= 0; bits-= 6) {
		*out++  = ((c >> bits) & 0x3F) | 0x80;
	    }
	    NEXT;
	}
    }
    *out = 0;
    return(buffer);
}